

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::ShaderAtomicCompSwapCase::iterate(ShaderAtomicCompSwapCase *this)

{
  ostringstream *poVar1;
  GLuint program;
  int iVar2;
  uint res;
  int iVar3;
  GLuint GVar4;
  uint uVar5;
  GLenum GVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  long lVar8;
  TestError *pTVar9;
  deUint32 ndx;
  uint uVar10;
  char *description;
  uint uVar11;
  uint uVar12;
  int iVar13;
  bool bVar14;
  Buffer inoutBuffer;
  InterfaceVariableInfo groupVarInfo;
  InterfaceVariableInfo outVarInfo;
  InterfaceVariableInfo exhVarInfo;
  InterfaceVariableInfo cmpVarInfo;
  InterfaceBlockInfo blockInfo;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bufData;
  allocator_type local_371;
  Functions *local_370;
  ShaderAtomicCompSwapCase *local_368;
  void *local_360;
  int local_358;
  uint local_354;
  ObjectWrapper local_350;
  InterfaceVariableInfo local_338;
  InterfaceVariableInfo local_2e8;
  InterfaceVariableInfo local_298;
  InterfaceVariableInfo local_248;
  InterfaceBlockInfo local_1f8;
  undefined1 local_1b0 [16];
  pointer local_1a0;
  ios_base local_138 [264];
  Functions *pFVar7;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pFVar7 = (Functions *)CONCAT44(extraout_var,iVar3);
  program = (this->m_program->m_program).m_program;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_350,(Functions *)CONCAT44(extraout_var_00,iVar3),traits);
  GVar4 = (*pFVar7->getProgramResourceIndex)(program,0x92e6,"InOut");
  local_1f8.name._M_dataplus._M_p = (pointer)&local_1f8.name.field_2;
  local_1f8.name._M_string_length = 0;
  local_1f8.name.field_2._M_local_buf[0] = '\0';
  local_1f8.index = 0xffffffff;
  local_1f8.bufferBinding = 0;
  local_1f8.dataSize = 0;
  local_1f8.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  glu::getProgramInterfaceBlockInfo(pFVar7,program,0x92e6,GVar4,&local_1f8);
  GVar4 = (*pFVar7->getProgramResourceIndex)(program,0x92e5,"InOut.compareValues[0]");
  local_248.name._M_dataplus._M_p = (pointer)&local_248.name.field_2;
  local_248.name._M_string_length = 0;
  local_248.name.field_2._M_local_buf[0] = '\0';
  local_248.index = 0xffffffff;
  local_248.blockIndex = 0xffffffff;
  local_248.atomicCounterBufferIndex = 0xffffffff;
  local_248.type = 0;
  local_248.arraySize = 0;
  local_248.offset = 0;
  local_248.arrayStride = 0;
  local_248._60_5_ = 0;
  local_248._65_8_ = 0;
  glu::getProgramInterfaceVariableInfo(pFVar7,program,0x92e5,GVar4,&local_248);
  GVar4 = (*pFVar7->getProgramResourceIndex)(program,0x92e5,"InOut.exchangeValues[0]");
  local_298.name._M_dataplus._M_p = (pointer)&local_298.name.field_2;
  local_298.name._M_string_length = 0;
  local_298.name.field_2._M_local_buf[0] = '\0';
  local_298.index = 0xffffffff;
  local_298.blockIndex = 0xffffffff;
  local_298.atomicCounterBufferIndex = 0xffffffff;
  local_298.type = 0;
  local_298.arraySize = 0;
  local_298.offset = 0;
  local_298.arrayStride = 0;
  local_298._60_5_ = 0;
  local_298._65_8_ = 0;
  glu::getProgramInterfaceVariableInfo(pFVar7,program,0x92e5,GVar4,&local_298);
  GVar4 = (*pFVar7->getProgramResourceIndex)(program,0x92e5,"InOut.outputValues[0]");
  local_2e8.name._M_dataplus._M_p = (pointer)&local_2e8.name.field_2;
  local_2e8.name._M_string_length = 0;
  local_2e8.name.field_2._M_local_buf[0] = '\0';
  local_2e8.index = 0xffffffff;
  local_2e8.blockIndex = 0xffffffff;
  local_2e8.atomicCounterBufferIndex = 0xffffffff;
  local_2e8.type = 0;
  local_2e8.arraySize = 0;
  local_2e8.offset = 0;
  local_2e8.arrayStride = 0;
  local_2e8._60_5_ = 0;
  local_2e8._65_8_ = 0;
  glu::getProgramInterfaceVariableInfo(pFVar7,program,0x92e5,GVar4,&local_2e8);
  GVar4 = (*pFVar7->getProgramResourceIndex)(program,0x92e5,"InOut.groupValues[0]");
  local_338.name._M_dataplus._M_p = (pointer)&local_338.name.field_2;
  local_338.name._M_string_length = 0;
  local_338.name.field_2._M_local_buf[0] = '\0';
  local_338.index = 0xffffffff;
  local_338.blockIndex = 0xffffffff;
  local_338.atomicCounterBufferIndex = 0xffffffff;
  local_338.type = 0;
  local_338.arraySize = 0;
  local_338.offset = 0;
  local_338.arrayStride = 0;
  local_338._60_5_ = 0;
  local_338._65_8_ = 0;
  glu::getProgramInterfaceVariableInfo(pFVar7,program,0x92e5,GVar4,&local_338);
  uVar10 = (this->m_workGroupSize).m_data[0];
  lVar8 = 0;
  do {
    uVar10 = uVar10 * (this->m_workGroupSize).m_data[lVar8 + 1];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 2);
  uVar5 = (this->m_numWorkGroups).m_data[0];
  lVar8 = 0;
  uVar11 = uVar5;
  do {
    uVar11 = uVar11 * (this->m_numWorkGroups).m_data[lVar8 + 1];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 2);
  uVar11 = uVar11 * uVar10;
  if (((local_248.arraySize == uVar11) && (local_298.arraySize == uVar11)) &&
     (local_2e8.arraySize == uVar11)) {
    lVar8 = 0;
    do {
      uVar5 = uVar5 * (this->m_numWorkGroups).m_data[lVar8 + 1];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 2);
    if (local_338.arraySize == uVar5) {
      local_370 = pFVar7;
      (*pFVar7->useProgram)(program);
      uVar10 = (this->m_workGroupSize).m_data[0];
      lVar8 = 0;
      do {
        uVar10 = uVar10 * (this->m_workGroupSize).m_data[lVar8 + 1];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 2);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1b0,
                 (ulong)local_1f8.dataSize,&local_371);
      pFVar7 = local_370;
      if (local_1b0._0_8_ != local_1b0._8_8_) {
        memset((void *)local_1b0._0_8_,0,local_1b0._8_8_ - local_1b0._0_8_);
      }
      if (uVar11 != 0) {
        uVar5 = 0;
        do {
          *(uint *)((long)(qpTestLog **)local_1b0._0_8_ +
                   (ulong)(local_248.arrayStride * uVar5) + (ulong)local_248.offset) =
               uVar5 % uVar10;
          uVar5 = uVar5 + 1;
        } while (uVar11 != uVar5);
        uVar5 = 0;
        do {
          *(uint *)((long)(qpTestLog **)local_1b0._0_8_ +
                   (ulong)(local_298.arrayStride * uVar5) + (ulong)local_298.offset) =
               uVar5 % uVar10 + 1;
          uVar5 = uVar5 + 1;
        } while (uVar11 != uVar5);
      }
      (*pFVar7->bindBuffer)(0x90d2,local_350.m_object);
      (*pFVar7->bufferData)(0x90d2,(ulong)local_1f8.dataSize,(void *)local_1b0._0_8_,0x88e5);
      (*pFVar7->bindBufferBase)(0x90d2,0,local_350.m_object);
      GVar6 = (*pFVar7->getError)();
      glu::checkError(GVar6,"Output buffer setup failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderAtomicOpTests.cpp"
                      ,0x40a);
      if ((TestLog *)local_1b0._0_8_ != (TestLog *)0x0) {
        operator_delete((void *)local_1b0._0_8_,(long)local_1a0 - local_1b0._0_8_);
      }
      (*pFVar7->dispatchCompute)
                ((this->m_numWorkGroups).m_data[0],(this->m_numWorkGroups).m_data[1],
                 (this->m_numWorkGroups).m_data[2]);
      pFVar7 = local_370;
      local_360 = (*local_370->mapBufferRange)(0x90d2,0,(ulong)local_1f8.dataSize,1);
      uVar10 = (this->m_numWorkGroups).m_data[0];
      lVar8 = 0;
      do {
        uVar10 = uVar10 * (this->m_numWorkGroups).m_data[lVar8 + 1];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 2);
      lVar8 = 0;
      uVar5 = (this->m_workGroupSize).m_data[0];
      do {
        uVar12 = uVar5;
        uVar11 = (this->m_workGroupSize).m_data[lVar8 + 1];
        uVar5 = uVar11 * uVar12;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 2);
      GVar6 = (*pFVar7->getError)();
      glu::checkError(GVar6,"glMapBufferRange()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderAtomicOpTests.cpp"
                      ,0x416);
      if (local_360 == (void *)0x0) {
        pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar9,(char *)0x0,"resPtr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderAtomicOpTests.cpp"
                   ,0x417);
        __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      if ((int)uVar10 < 1) {
        bVar14 = true;
      }
      else {
        poVar1 = (ostringstream *)(local_1b0 + 8);
        local_358 = uVar11 * uVar12;
        bVar14 = true;
        iVar3 = 0;
        uVar11 = 0;
        local_368 = this;
        local_354 = uVar10;
        do {
          uVar10 = *(uint *)((long)local_360 +
                            (long)(int)(local_338.arrayStride * uVar11) + (ulong)local_338.offset);
          if (0 < (int)uVar5) {
            iVar13 = 0;
            do {
              iVar2 = *(int *)((long)local_360 +
                              (long)((iVar3 + iVar13) * local_2e8.arrayStride) +
                              (ulong)local_2e8.offset);
              if (iVar13 != iVar2) {
                local_1b0._0_8_ =
                     ((local_368->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                std::__cxx11::ostringstream::ostringstream(poVar1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar1,"ERROR: at group ",0x10);
                std::ostream::operator<<(poVar1,uVar11);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar1,", invocation ",0xd);
                std::ostream::operator<<(poVar1,iVar13);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar1,": expected ",0xb);
                std::ostream::operator<<(poVar1,iVar13);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", got ",6);
                std::ostream::operator<<(poVar1,iVar2);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream(poVar1);
                std::ios_base::~ios_base(local_138);
                bVar14 = false;
                break;
              }
              iVar13 = iVar13 + 1;
            } while (iVar13 < (int)uVar5);
          }
          if (uVar10 != uVar5) {
            local_1b0._0_8_ =
                 ((local_368->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"ERROR: at group ",0x10);
            std::ostream::operator<<(poVar1,uVar11);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,": expected",10);
            std::ostream::operator<<(poVar1,uVar5);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", got ",6);
            std::ostream::operator<<(poVar1,uVar10);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base(local_138);
            bVar14 = false;
            this = local_368;
            break;
          }
          uVar11 = uVar11 + 1;
          iVar3 = iVar3 + local_358;
          this = local_368;
        } while (uVar11 != local_354);
      }
      (*local_370->unmapBuffer)(0x90d2);
      GVar6 = (*local_370->getError)();
      glu::checkError(GVar6,"glUnmapBuffer()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderAtomicOpTests.cpp"
                      ,0x436);
      description = "Comparison failed";
      if (bVar14) {
        description = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 (byte)~bVar14 & QP_TEST_RESULT_FAIL,description);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338.name._M_dataplus._M_p != &local_338.name.field_2) {
        operator_delete(local_338.name._M_dataplus._M_p,
                        CONCAT71(local_338.name.field_2._M_allocated_capacity._1_7_,
                                 local_338.name.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8.name._M_dataplus._M_p != &local_2e8.name.field_2) {
        operator_delete(local_2e8.name._M_dataplus._M_p,
                        CONCAT71(local_2e8.name.field_2._M_allocated_capacity._1_7_,
                                 local_2e8.name.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298.name._M_dataplus._M_p != &local_298.name.field_2) {
        operator_delete(local_298.name._M_dataplus._M_p,
                        CONCAT71(local_298.name.field_2._M_allocated_capacity._1_7_,
                                 local_298.name.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248.name._M_dataplus._M_p != &local_248.name.field_2) {
        operator_delete(local_248.name._M_dataplus._M_p,
                        CONCAT71(local_248.name.field_2._M_allocated_capacity._1_7_,
                                 local_248.name.field_2._M_local_buf[0]) + 1);
      }
      if (local_1f8.activeVariables.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1f8.activeVariables.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_1f8.activeVariables.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1f8.activeVariables.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8.name._M_dataplus._M_p != &local_1f8.name.field_2) {
        operator_delete(local_1f8.name._M_dataplus._M_p,
                        CONCAT71(local_1f8.name.field_2._M_allocated_capacity._1_7_,
                                 local_1f8.name.field_2._M_local_buf[0]) + 1);
      }
      glu::ObjectWrapper::~ObjectWrapper(&local_350);
      return STOP;
    }
  }
  pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar9,(char *)0x0,
             "cmpVarInfo.arraySize == numValues && exhVarInfo.arraySize == numValues && outVarInfo.arraySize == numValues && groupVarInfo.arraySize == product(m_numWorkGroups)"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderAtomicOpTests.cpp"
             ,0x3f4);
  __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

ShaderAtomicOpCase::IterateResult ShaderAtomicCompSwapCase::iterate (void)
{
	const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
	const deUint32				program			= m_program->getProgram();
	const Buffer				inoutBuffer		(m_context.getRenderContext());
	const deUint32				blockNdx		= gl.getProgramResourceIndex(program, GL_SHADER_STORAGE_BLOCK, "InOut");
	const InterfaceBlockInfo	blockInfo		= getProgramInterfaceBlockInfo(gl, program, GL_SHADER_STORAGE_BLOCK, blockNdx);
	const deUint32				cmpVarNdx		= gl.getProgramResourceIndex(program, GL_BUFFER_VARIABLE, "InOut.compareValues[0]");
	const InterfaceVariableInfo	cmpVarInfo		= getProgramInterfaceVariableInfo(gl, program, GL_BUFFER_VARIABLE, cmpVarNdx);
	const deUint32				exhVarNdx		= gl.getProgramResourceIndex(program, GL_BUFFER_VARIABLE, "InOut.exchangeValues[0]");
	const InterfaceVariableInfo	exhVarInfo		= getProgramInterfaceVariableInfo(gl, program, GL_BUFFER_VARIABLE, exhVarNdx);
	const deUint32				outVarNdx		= gl.getProgramResourceIndex(program, GL_BUFFER_VARIABLE, "InOut.outputValues[0]");
	const InterfaceVariableInfo	outVarInfo		= getProgramInterfaceVariableInfo(gl, program, GL_BUFFER_VARIABLE, outVarNdx);
	const deUint32				groupVarNdx		= gl.getProgramResourceIndex(program, GL_BUFFER_VARIABLE, "InOut.groupValues[0]");
	const InterfaceVariableInfo	groupVarInfo	= getProgramInterfaceVariableInfo(gl, program, GL_BUFFER_VARIABLE, groupVarNdx);
	const deUint32				numValues		= product(m_workGroupSize)*product(m_numWorkGroups);

	TCU_CHECK(cmpVarInfo.arraySize == numValues &&
			  exhVarInfo.arraySize == numValues &&
			  outVarInfo.arraySize == numValues &&
			  groupVarInfo.arraySize == product(m_numWorkGroups));

	gl.useProgram(program);

	// \todo [2013-09-05 pyry] Use randomized input values!

	// Setup buffer.
	{
		const deUint32	workGroupSize	= product(m_workGroupSize);
		vector<deUint8>	bufData			(blockInfo.dataSize);

		std::fill(bufData.begin(), bufData.end(), 0);

		for (deUint32 ndx = 0; ndx < numValues; ndx++)
			*(deUint32*)(&bufData[0] + cmpVarInfo.offset + cmpVarInfo.arrayStride*ndx) = ndx%workGroupSize;

		for (deUint32 ndx = 0; ndx < numValues; ndx++)
			*(deUint32*)(&bufData[0] + exhVarInfo.offset + exhVarInfo.arrayStride*ndx) = (ndx%workGroupSize)+1;

		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *inoutBuffer);
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, blockInfo.dataSize, &bufData[0], GL_STATIC_READ);
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, *inoutBuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Output buffer setup failed");
	}

	gl.dispatchCompute(m_numWorkGroups.x(), m_numWorkGroups.y(), m_numWorkGroups.z());

	// Read back and compare
	{
		const void*		resPtr			= gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, blockInfo.dataSize, GL_MAP_READ_BIT);
		const int		numWorkGroups	= (int)product(m_numWorkGroups);
		const int		workGroupSize	= (int)product(m_workGroupSize);
		bool			isOk			= true;

		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange()");
		TCU_CHECK(resPtr);

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int	groupOffset		= groupNdx*workGroupSize;
			const int	groupOutput		= *(const deInt32*)((const deUint8*)resPtr + groupVarInfo.offset + groupNdx*groupVarInfo.arrayStride);

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const int	refValue		= localNdx;
				const int	outputValue		= *(const deInt32*)((const deUint8*)resPtr + outVarInfo.offset + outVarInfo.arrayStride*(groupOffset+localNdx));

				if (outputValue != refValue)
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ", invocation " << localNdx
														   << ": expected " << refValue << ", got " << outputValue
									   << TestLog::EndMessage;
					isOk = false;
					break;
				}
			}

			if (groupOutput != workGroupSize)
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ": expected" << workGroupSize << ", got " << groupOutput << TestLog::EndMessage;
				isOk = false;
				break;
			}
		}

		gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer()");

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Comparison failed");
	}

	return STOP;
}